

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O3

void __thiscall
dg::vr::ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>
          (ValueRelations *this,Bucket *lt,Relations rels,Bucket *rt)

{
  bool bVar1;
  Type TVar2;
  ulong *puVar3;
  ulong uVar4;
  Relations other;
  
  TVar2 = dg::vr::Relations::get();
  bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                    (&this->graph,lt,TVar2,rt,(Relations *)0x0);
  this->changed = (bool)(this->changed | bVar1);
  if (((ulong)rels.bits.super__Base_bitset<1UL>._M_w & 0x330) != 0) {
    if (PF < TVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)TVar2,
                 0xc);
    }
    puVar3 = (ulong *)dg::vr::Relations::addImplied();
    uVar4 = dg::vr::Relations::get();
    if ((*puVar3 >> (uVar4 & 0x3f) & 1) == 0) {
      TVar2 = dg::vr::Relations::get();
      bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                        (&this->graph,lt,TVar2,rt,(Relations *)0x0);
      this->changed = (bool)(this->changed | bVar1);
    }
  }
  return;
}

Assistant:

void set(const X &lt, Relations rels, const Y &rt) {
        Relations::Type rel = rels.get();
        set(lt, rel, rt);
        Relations other = rels & Relations().ult().ule().ugt().uge();
        if (other.any() && !Relations().set(rel).addImplied().has(other.get()))
            set(lt, other.get(), rt);
    }